

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::uniform_matrixfv_incompatible_type
               (NegativeTestContext *ctx)

{
  undefined *puVar1;
  int iVar2;
  GLint GVar3;
  deUint64 dVar4;
  deUint32 dVar5;
  RenderContext *renderCtx;
  TestLog *this;
  MessageBuilder *this_00;
  reference pvVar6;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<float> local_3d9;
  undefined1 local_3d8 [8];
  vector<float,_std::allocator<float>_> data;
  string local_3b8;
  MessageBuilder local_398;
  int local_214;
  GLint local_210;
  GLint sampler_f;
  GLint mat4_v;
  allocator<char> local_1d1;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)ctx;
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = uniformTestVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,puVar1,&local_1d1);
  puVar1 = uniformTestFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mat4_v,puVar1,(allocator<char> *)((long)&sampler_f + 3));
  glu::makeVtxFragSources(&local_1b0,&local_1d0,(string *)&mat4_v);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&mat4_v);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sampler_f + 3));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  dVar4 = program.m_program.m_info.linkTimeUs;
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar4,dVar5);
  dVar4 = program.m_program.m_info.linkTimeUs;
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  local_210 = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)dVar4,dVar5,"mat4_v");
  dVar4 = program.m_program.m_info.linkTimeUs;
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  local_214 = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)dVar4,dVar5,"sampler_f");
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  if ((local_210 == -1) || (local_214 == -1)) {
    this = glu::CallLogWrapper::getLog((CallLogWrapper *)program.m_program.m_info.linkTimeUs);
    tcu::TestLog::operator<<(&local_398,this,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_398,(char (*) [46])"// ERROR: Failed to retrieve uniform location");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_398);
    dVar4 = program.m_program.m_info.linkTimeUs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"Failed to retrieve uniform location",
               (allocator<char> *)
               ((long)&data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    NegativeTestContext::fail((NegativeTestContext *)dVar4,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::allocator<float>::allocator(&local_3d9);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_3d8,0x10,&local_3d9);
  std::allocator<float>::~allocator(&local_3d9);
  dVar4 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,
             "GL_INVALID_OPERATION is generated if the size of the uniform variable declared in the shader does not match the size indicated by the ctx.glUniform command."
             ,&local_401);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar4,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  dVar4 = program.m_program.m_info.linkTimeUs;
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar4,dVar5);
  dVar4 = program.m_program.m_info.linkTimeUs;
  GVar3 = local_210;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix2fv((CallLogWrapper *)dVar4,GVar3,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  GVar3 = local_210;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix3fv((CallLogWrapper *)dVar4,GVar3,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  GVar3 = local_210;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix4fv((CallLogWrapper *)dVar4,GVar3,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar4 = program.m_program.m_info.linkTimeUs;
  GVar3 = local_210;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix2x3fv((CallLogWrapper *)dVar4,GVar3,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  GVar3 = local_210;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix3x2fv((CallLogWrapper *)dVar4,GVar3,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  GVar3 = local_210;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix2x4fv((CallLogWrapper *)dVar4,GVar3,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  GVar3 = local_210;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix4x2fv((CallLogWrapper *)dVar4,GVar3,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  GVar3 = local_210;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix3x4fv((CallLogWrapper *)dVar4,GVar3,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  GVar3 = local_210;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix4x3fv((CallLogWrapper *)dVar4,GVar3,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  dVar4 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,
             "GL_INVALID_OPERATION is generated if a sampler is loaded using a command other than ctx.glUniform1i and ctx.glUniform1iv."
             ,&local_429);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar4,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  dVar4 = program.m_program.m_info.linkTimeUs;
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar4,dVar5);
  dVar4 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_214;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix2fv((CallLogWrapper *)dVar4,iVar2,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_214;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix3fv((CallLogWrapper *)dVar4,iVar2,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_214;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix4fv((CallLogWrapper *)dVar4,iVar2,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_214;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix2x3fv((CallLogWrapper *)dVar4,iVar2,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_214;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix3x2fv((CallLogWrapper *)dVar4,iVar2,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_214;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix2x4fv((CallLogWrapper *)dVar4,iVar2,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_214;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix4x2fv((CallLogWrapper *)dVar4,iVar2,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_214;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix3x4fv((CallLogWrapper *)dVar4,iVar2,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar4 = program.m_program.m_info.linkTimeUs;
  iVar2 = local_214;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_3d8,0);
  glu::CallLogWrapper::glUniformMatrix4x3fv((CallLogWrapper *)dVar4,iVar2,1,'\0',pvVar6);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)program.m_program.m_info.linkTimeUs,0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_3d8);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void uniform_matrixfv_incompatible_type (NegativeTestContext& ctx)
{
	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(uniformTestVertSource, uniformTestFragSource));

	ctx.glUseProgram			(program.getProgram());
	GLint mat4_v			= ctx.glGetUniformLocation(program.getProgram(), "mat4_v");	// mat4
	GLint sampler_f			= ctx.glGetUniformLocation(program.getProgram(), "sampler_f");	// sampler2D
	ctx.expectError(GL_NO_ERROR);

	if (mat4_v == -1 || sampler_f == -1)
	{
		ctx.getLog() << TestLog::Message << "// ERROR: Failed to retrieve uniform location" << TestLog::EndMessage;
		ctx.fail("Failed to retrieve uniform location");
	}

	std::vector<GLfloat> data(16);

	ctx.beginSection("GL_INVALID_OPERATION is generated if the size of the uniform variable declared in the shader does not match the size indicated by the ctx.glUniform command.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniformMatrix2fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_NO_ERROR);

	ctx.glUniformMatrix2x3fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3x2fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix2x4fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4x2fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3x4fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4x3fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if a sampler is loaded using a command other than ctx.glUniform1i and ctx.glUniform1iv.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniformMatrix2fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glUniformMatrix2x3fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3x2fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix2x4fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4x2fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3x4fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4x3fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glUseProgram(0);
}